

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnTableInit
          (SharedValidator *this,Location *loc,Var *segment_var,Var *table_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  Result RVar5;
  ElemType elem_type;
  TableType table_type;
  ElemType local_100;
  TableType local_e8;
  Var local_c0;
  Var local_78;
  
  RVar1 = CheckInstr(this,(Opcode)0xd3,loc);
  local_e8.limits.max._0_3_ = 0;
  local_e8.limits._11_8_ = 0;
  local_e8.element.enum_ = Any;
  local_e8.element.type_index_ = 0;
  local_e8.limits.initial._0_3_ = 0;
  local_e8.limits.initial._3_5_ = 0;
  Var::Var(&local_78,table_var);
  RVar2 = CheckTableIndex(this,&local_78,&local_e8);
  Var::~Var(&local_78);
  Var::Var(&local_c0,segment_var);
  RVar3 = CheckElemSegmentIndex(this,&local_c0,&local_100);
  Var::~Var(&local_c0);
  if (segment_var->type_ == Index) {
    RVar4 = TypeChecker::OnTableInit
                      (&this->typechecker_,(segment_var->field_2).index_,&local_e8.limits);
    RVar5 = CheckType(this,loc,local_100.element,local_e8.element,"table.init");
    RVar1.enum_._0_1_ =
         RVar5.enum_ == Error ||
         (RVar4.enum_ == Error ||
         (RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error)));
    RVar1.enum_._1_3_ = 0;
    return (Result)RVar1.enum_;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                ,0x3b,"Index wabt::Var::index() const");
}

Assistant:

Result SharedValidator::OnTableInit(const Location& loc,
                                    Var segment_var,
                                    Var table_var) {
  Result result = CheckInstr(Opcode::TableInit, loc);
  TableType table_type;
  ElemType elem_type;
  result |= CheckTableIndex(table_var, &table_type);
  result |= CheckElemSegmentIndex(segment_var, &elem_type);
  result |= typechecker_.OnTableInit(segment_var.index(), table_type.limits);
  result |= CheckType(loc, elem_type.element, table_type.element, "table.init");
  return result;
}